

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inline_pass.cpp
# Opt level: O0

bool __thiscall
spvtools::opt::InlinePass::ContainsAbortOtherThanUnreachable(InlinePass *this,Function *func)

{
  bool bVar1;
  anon_class_1_0_00000001 local_39;
  function<bool_(spvtools::opt::Instruction_*)> local_38;
  Function *local_18;
  Function *func_local;
  InlinePass *this_local;
  
  local_18 = func;
  func_local = (Function *)this;
  std::function<bool(spvtools::opt::Instruction*)>::
  function<spvtools::opt::InlinePass::ContainsAbortOtherThanUnreachable(spvtools::opt::Function*)const::__0,void>
            ((function<bool(spvtools::opt::Instruction*)> *)&local_38,&local_39);
  bVar1 = Function::WhileEachInst(func,&local_38,false,false);
  std::function<bool_(spvtools::opt::Instruction_*)>::~function(&local_38);
  return (bool)((bVar1 ^ 0xffU) & 1);
}

Assistant:

bool InlinePass::ContainsAbortOtherThanUnreachable(Function* func) const {
  return !func->WhileEachInst([](Instruction* inst) {
    return inst->opcode() == spv::Op::OpUnreachable ||
           !spvOpcodeIsAbort(inst->opcode());
  });
}